

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace-type-impl.cpp
# Opt level: O3

void __thiscall yactfr::internal::TraceTypeImpl::_setDispNames(TraceTypeImpl *this)

{
  StructureType *this_00;
  _Rb_tree_node_base *p_Var1;
  long lVar2;
  socklen_t *in_RCX;
  sockaddr *in_RDX;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  sockaddr *extraout_RDX_02;
  sockaddr *extraout_RDX_03;
  sockaddr *psVar4;
  int __fd;
  long lVar5;
  _Rb_tree_node_base *p_Var6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  SetDispNamesDtVisitor visitor;
  undefined **local_38;
  undefined1 local_30;
  _Base_ptr p_Var3;
  
  local_30 = this->_majorVersion == 1;
  local_38 = &PTR__DataTypeVisitor_002fe008;
  this_00 = (this->_pktHeaderType)._M_t.
            super___uniq_ptr_impl<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
            ._M_t.
            super__Tuple_impl<0UL,_const_yactfr::StructureType_*,_std::default_delete<const_yactfr::StructureType>_>
            .super__Head_base<0UL,_const_yactfr::StructureType_*,_false>._M_head_impl;
  __fd = (int)&local_38;
  if (this_00 != (StructureType *)0x0) {
    DataType::accept((DataType *)this_00,__fd,in_RDX,in_RCX);
    in_RDX = extraout_RDX;
  }
  p_Var3 = (this->_dsts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  auVar8._8_8_ = in_RDX;
  auVar8._0_8_ = p_Var3;
  while ((_Rb_tree_header *)p_Var3 != &(this->_dsts)._M_t._M_impl.super__Rb_tree_header) {
    psVar4 = auVar8._8_8_;
    p_Var6 = auVar8._0_8_;
    lVar5 = *(long *)(p_Var6 + 1);
    if (*(DataType **)(lVar5 + 0xe8) != (DataType *)0x0) {
      DataType::accept(*(DataType **)(lVar5 + 0xe8),__fd,psVar4,in_RCX);
      lVar5 = *(long *)(p_Var6 + 1);
      psVar4 = extraout_RDX_00;
    }
    if (*(DataType **)(lVar5 + 0xf0) != (DataType *)0x0) {
      DataType::accept(*(DataType **)(lVar5 + 0xf0),__fd,psVar4,in_RCX);
      lVar5 = *(long *)(p_Var6 + 1);
      psVar4 = extraout_RDX_01;
    }
    if (*(DataType **)(lVar5 + 0xf8) != (DataType *)0x0) {
      DataType::accept(*(DataType **)(lVar5 + 0xf8),__fd,psVar4,in_RCX);
      lVar5 = *(long *)(p_Var6 + 1);
      psVar4 = extraout_RDX_02;
    }
    auVar7._8_8_ = psVar4;
    auVar7._0_8_ = *(undefined8 *)(lVar5 + 0x98);
    while( true ) {
      psVar4 = auVar7._8_8_;
      p_Var1 = auVar7._0_8_;
      if (p_Var1 == (_Rb_tree_node_base *)(lVar5 + 0x88)) break;
      lVar2 = *(long *)(p_Var1 + 1);
      if (*(DataType **)(lVar2 + 0xb8) != (DataType *)0x0) {
        DataType::accept(*(DataType **)(lVar2 + 0xb8),__fd,psVar4,in_RCX);
        lVar2 = *(long *)(p_Var1 + 1);
        psVar4 = extraout_RDX_03;
      }
      if (*(DataType **)(lVar2 + 0xc0) != (DataType *)0x0) {
        DataType::accept(*(DataType **)(lVar2 + 0xc0),__fd,psVar4,in_RCX);
      }
      auVar7 = std::_Rb_tree_increment(p_Var1);
    }
    auVar8 = std::_Rb_tree_increment(p_Var6);
    p_Var3 = auVar8._0_8_;
  }
  return;
}

Assistant:

void TraceTypeImpl::_setDispNames() const
{
    SetDispNamesDtVisitor visitor {_majorVersion == 1};

    if (_pktHeaderType) {
        _pktHeaderType->accept(visitor);
    }

    for (auto& dst : _dsts) {
        if (dst->packetContextType()) {
            dst->packetContextType()->accept(visitor);
        }

        if (dst->eventRecordHeaderType()) {
            dst->eventRecordHeaderType()->accept(visitor);
        }

        if (dst->eventRecordCommonContextType()) {
            dst->eventRecordCommonContextType()->accept(visitor);
        }

        for (auto& ert : dst->eventRecordTypes()) {
            if (ert->specificContextType()) {
                ert->specificContextType()->accept(visitor);
            }

            if (ert->payloadType()) {
                ert->payloadType()->accept(visitor);
            }
        }
    }
}